

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O2

kmp_uint64 __thiscall kmp_taskloop_bounds_t::get_lb(kmp_taskloop_bounds_t *this)

{
  kmp_uint64 *pkVar1;
  kmp_int32 *lb;
  
  if (((this->taskdata->td_flags).field_0x3 & 1) == 0) {
    return *(kmp_uint64 *)((long)&this->task->shareds + this->lower_offset);
  }
  pkVar1 = (kmp_uint64 *)this->task->shareds;
  if (this->taskdata->td_size_loop_bounds == 4) {
    return (long)(int)*pkVar1;
  }
  return *pkVar1;
}

Assistant:

kmp_uint64 get_lb() const {
    kmp_int64 retval;
#if defined(KMP_GOMP_COMPAT)
    // Intel task just returns the lower bound normally
    if (!taskdata->td_flags.native) {
      retval = *(kmp_int64 *)((char *)task + lower_offset);
    } else {
      // GOMP task has to take into account the sizeof(long)
      if (taskdata->td_size_loop_bounds == 4) {
        kmp_int32 *lb = RCAST(kmp_int32 *, task->shareds);
        retval = (kmp_int64)*lb;
      } else {
        kmp_int64 *lb = RCAST(kmp_int64 *, task->shareds);
        retval = (kmp_int64)*lb;
      }
    }
#else
    retval = *(kmp_int64 *)((char *)task + lower_offset);
#endif // defined(KMP_GOMP_COMPAT)
    return retval;
  }